

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkDfsIterNodes(Abc_Ntk_t *pNtk,Vec_Ptr_t *vRoots)

{
  int iVar1;
  Vec_Ptr_t *vNodes_00;
  Vec_Ptr_t *vStack_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *p;
  undefined4 local_34;
  int i;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vStack;
  Vec_Ptr_t *vNodes;
  Vec_Ptr_t *vRoots_local;
  Abc_Ntk_t *pNtk_local;
  
  Abc_NtkIncrementTravId(pNtk);
  vNodes_00 = Vec_PtrAlloc(1000);
  vStack_00 = Vec_PtrAlloc(1000);
  for (local_34 = 0; iVar1 = Vec_PtrSize(vRoots), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar2 = (Abc_Obj_t *)Vec_PtrEntry(vRoots,local_34);
    p = Abc_ObjRegular(pAVar2);
    iVar1 = Abc_NodeIsTravIdCurrent(p);
    if (iVar1 == 0) {
      pAVar2 = Abc_ObjRegular(pAVar2);
      Abc_NtkDfs_iter(vStack_00,pAVar2,vNodes_00);
    }
  }
  Vec_PtrFree(vStack_00);
  return vNodes_00;
}

Assistant:

Vec_Ptr_t * Abc_NtkDfsIterNodes( Abc_Ntk_t * pNtk, Vec_Ptr_t * vRoots )
{
    Vec_Ptr_t * vNodes, * vStack;
    Abc_Obj_t * pObj;
    int i;
    Abc_NtkIncrementTravId( pNtk );
    vNodes = Vec_PtrAlloc( 1000 );
    vStack = Vec_PtrAlloc( 1000 );
    Vec_PtrForEachEntry( Abc_Obj_t *, vRoots, pObj, i )
        if ( !Abc_NodeIsTravIdCurrent(Abc_ObjRegular(pObj)) )
            Abc_NtkDfs_iter( vStack, Abc_ObjRegular(pObj), vNodes );
    Vec_PtrFree( vStack );
    return vNodes;
}